

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  uint uVar3;
  int i;
  int iVar4;
  Vec_Wrd_t *p_00;
  word wVar5;
  Vec_Int_t *pVVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((uVar3 != 2) && (uVar3 != 5)) {
      if (uVar3 != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0x121,
                      "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
        ;
      }
      p_00 = Abc_NtkShareSuperAnd(pObj,&p->nFoundGates);
      iVar2 = p_00->nSize;
      if ((iVar2 < 2) || (p->nMultiSize <= iVar2)) {
        iVar8 = 0;
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        for (; iVar2 != iVar8; iVar8 = iVar8 + 1) {
          wVar5 = Vec_WrdEntry(p_00,iVar8);
          iVar4 = (int)wVar5;
          pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vInputs,iVar4);
          if (pVVar6 == (Vec_Int_t *)0x0) {
            pVVar6 = Vec_IntAlloc(10);
            Vec_IntPush(pVVar6,iVar4);
            pAVar1 = p->pNtk;
            i = Abc_Lit2Var(iVar4);
            pAVar7 = Abc_NtkObj(pAVar1,i);
            Vec_IntPush(pVVar6,*(uint *)&pAVar7->field_0x14 >> 0xc);
            if (pVVar6->nSize != 2) {
              __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                            ,0x12d,
                            "void Abc_NtkTraverseSupersAnd_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                           );
            }
            Vec_PtrWriteEntry(vInputs,iVar4,pVVar6);
          }
          Vec_IntPush(pVVar6,p->vObj2Lit->nSize);
        }
        pVVar6 = p->vObj2Lit;
        iVar8 = Abc_ObjToLit(pObj);
        Vec_IntPush(pVVar6,iVar8);
      }
      for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
        wVar5 = Vec_WrdEntry(p_00,iVar8);
        pAVar1 = p->pNtk;
        iVar4 = Abc_Lit2Var((int)wVar5);
        pAVar7 = Abc_NtkObj(pAVar1,iVar4);
        Abc_NtkTraverseSupersAnd_rec(p,pAVar7,vInputs);
      }
      Vec_WrdFree(p_00);
      return;
    }
  }
  return;
}

Assistant:

void Abc_NtkTraverseSupersAnd_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    Vec_Wrd_t * vSuper;
    word Num;
    int k;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    vSuper = Abc_NtkShareSuperAnd( pObj, &p->nFoundGates );
    if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
    {
        Vec_WrdForEachEntry( vSuper, Num, k )
        {
            Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
            if ( vInput == NULL )
            {
                vInput = Vec_IntAlloc( 10 );
                Vec_IntPush( vInput, (int)Num );
                Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num))) );
                assert( SHARE_NUM == Vec_IntSize(vInput) );
                Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
            }
            Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
        }
        Vec_IntPush( p->vObj2Lit, Abc_ObjToLit(pObj) );
    }
    // call recursively
    Vec_WrdForEachEntry( vSuper, Num, k )
        Abc_NtkTraverseSupersAnd_rec( p, Abc_NtkObj(p->pNtk, Abc_Lit2Var((int)Num)), vInputs );
    Vec_WrdFree( vSuper );
}